

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * flatbuffers::BufferToHexText
                   (string *__return_storage_ptr__,void *buffer,size_t buffer_size,size_t max_length
                   ,string *wrapped_line_prefix,string *wrapped_line_suffix)

{
  long lVar1;
  long lVar2;
  string local_90;
  byte local_59;
  ulong uStack_58;
  bool have_more;
  size_t i;
  char *s;
  size_t start_offset;
  string *local_38;
  string *wrapped_line_suffix_local;
  string *wrapped_line_prefix_local;
  size_t max_length_local;
  size_t buffer_size_local;
  void *buffer_local;
  string *text;
  
  start_offset._7_1_ = 0;
  local_38 = wrapped_line_suffix;
  wrapped_line_suffix_local = wrapped_line_prefix;
  wrapped_line_prefix_local = (string *)max_length;
  max_length_local = buffer_size;
  buffer_size_local = (size_t)buffer;
  buffer_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)wrapped_line_prefix);
  s = (char *)0x0;
  i = buffer_size_local;
  for (uStack_58 = 0; i != 0 && uStack_58 < max_length_local; uStack_58 = uStack_58 + 1) {
    local_59 = uStack_58 + 1 < max_length_local;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0x");
    IntToStringHex_abi_cxx11_
              (&local_90,(flatbuffers *)(ulong)*(byte *)(i + uStack_58),2,(int)uStack_58);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if ((local_59 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,',');
    }
    if ((local_59 & 1) != 0) {
      lVar1 = std::__cxx11::string::size();
      lVar2 = std::__cxx11::string::size();
      if (s + (long)wrapped_line_prefix_local <= (char *)(lVar1 + lVar2)) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_38);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
        s = (char *)std::__cxx11::string::size();
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,(string *)wrapped_line_suffix_local);
      }
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string BufferToHexText(const void *buffer, size_t buffer_size,
                                   size_t max_length,
                                   const std::string &wrapped_line_prefix,
                                   const std::string &wrapped_line_suffix) {
  std::string text = wrapped_line_prefix;
  size_t start_offset = 0;
  const char *s = reinterpret_cast<const char *>(buffer);
  for (size_t i = 0; s && i < buffer_size; i++) {
    // Last iteration or do we have more?
    bool have_more = i + 1 < buffer_size;
    text += "0x";
    text += IntToStringHex(static_cast<uint8_t>(s[i]), 2);
    if (have_more) { text += ','; }
    // If we have more to process and we reached max_length
    if (have_more &&
        text.size() + wrapped_line_suffix.size() >= start_offset + max_length) {
      text += wrapped_line_suffix;
      text += '\n';
      start_offset = text.size();
      text += wrapped_line_prefix;
    }
  }
  text += wrapped_line_suffix;
  return text;
}